

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindow::closeEvent(QMdiSubWindow *this,QCloseEvent *closeEvent)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QMdiSubWindowPrivate *this_00;
  QWidget *pQVar4;
  socklen_t *in_RCX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *__addr;
  QEvent *in_RSI;
  QEvent *pQVar5;
  QObject *in_RDI;
  long in_FS_OFFSET;
  bool acceptClose;
  QMdiSubWindowPrivate *d;
  QChildEvent childRemoved;
  bool in_stack_0000002e;
  bool in_stack_0000002f;
  QMdiSubWindowPrivate *in_stack_00000030;
  undefined4 in_stack_ffffffffffffffc4;
  WidgetAttribute attribute;
  QMdiSubWindowPrivate *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = in_RSI;
  this_00 = d_func((QMdiSubWindow *)0x63552e);
  iVar3 = (int)pQVar5;
  attribute = CONCAT13(1,(int3)in_stack_ffffffffffffffc4);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x635549);
  if (bVar2) {
    pQVar4 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x635560);
    iVar3 = QWidget::close(pQVar4,iVar3);
    attribute = CONCAT13((char)iVar3,(int3)attribute) & 0x1ffffff;
  }
  if ((attribute & 0x1000000) == WA_Disabled) {
    QEvent::ignore(in_RSI);
  }
  else {
    QMdiSubWindowPrivate::removeButtonsFromMenuBar(in_stack_ffffffffffffffe0);
    iVar3 = 0;
    QMdiSubWindowPrivate::setActive(in_stack_00000030,in_stack_0000002f,in_stack_0000002e);
    pQVar4 = QWidget::parentWidget((QWidget *)0x6355a8);
    __addr = extraout_RDX;
    if (pQVar4 != (QWidget *)0x0) {
      iVar3 = 0x37;
      bVar2 = QWidget::testAttribute((QWidget *)this_00,attribute);
      __addr = extraout_RDX_00;
      if (bVar2) {
        QChildEvent::QChildEvent((QChildEvent *)&stack0xffffffffffffffe0,ChildRemoved,in_RDI);
        pQVar4 = QWidget::parentWidget((QWidget *)0x635602);
        pQVar5 = (QEvent *)&stack0xffffffffffffffe0;
        QCoreApplication::sendEvent(&pQVar4->super_QObject,pQVar5);
        iVar3 = (int)pQVar5;
        QChildEvent::~QChildEvent((QChildEvent *)&stack0xffffffffffffffe0);
        __addr = extraout_RDX_01;
      }
    }
    QEvent::accept(in_RSI,iVar3,__addr,in_RCX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindow::closeEvent(QCloseEvent *closeEvent)
{
    Q_D(QMdiSubWindow);
    bool acceptClose = true;
    if (d->baseWidget)
        acceptClose = d->baseWidget->close();
    if (!acceptClose) {
        closeEvent->ignore();
        return;
    }
#if QT_CONFIG(menubar)
    d->removeButtonsFromMenuBar();
#endif
    d->setActive(false);
    if (parentWidget() && testAttribute(Qt::WA_DeleteOnClose)) {
        QChildEvent childRemoved(QEvent::ChildRemoved, this);
        QCoreApplication::sendEvent(parentWidget(), &childRemoved);
    }
    closeEvent->accept();
}